

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

bool __thiscall
imrt::ApertureILS::isBeamletModifiable
          (ApertureILS *this,int beamlet,Station *station,bool open_flag)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  byte in_CL;
  Station *in_RDX;
  int in_ESI;
  Station *in_RDI;
  iterator it;
  list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
  *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  _Self local_38;
  _Self local_30;
  byte local_21;
  Station *local_20;
  int local_14;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>::
       begin(in_stack_ffffffffffffffa8);
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>::
         end(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppVar3 = std::_List_iterator<std::pair<imrt::Station_*,_int>_>::operator->
                       ((_List_iterator<std::pair<imrt::Station_*,_int>_> *)0x15eab4);
    in_stack_ffffffffffffffb4 = Station::getAngle(ppVar3->first);
    iVar2 = Station::getAngle(local_20);
    if ((in_stack_ffffffffffffffb4 == iVar2) &&
       (ppVar3 = std::_List_iterator<std::pair<imrt::Station_*,_int>_>::operator->
                           ((_List_iterator<std::pair<imrt::Station_*,_int>_> *)0x15eade),
       ppVar3->second == local_14)) {
      return false;
    }
    std::_List_iterator<std::pair<imrt::Station_*,_int>_>::operator++(&local_30,0);
  }
  bVar1 = Station::isActiveBeamlet(in_RDI,in_stack_ffffffffffffffb4);
  if (!bVar1) {
    return false;
  }
  if ((local_21 & 1) == 0) {
    bVar1 = Station::anyOpen(in_RDI,in_stack_ffffffffffffffb4);
    if ((bVar1) &&
       (((ulong)(in_RDI->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0x10000000000)
        != 0)) {
      return true;
    }
    bVar1 = Station::canReduceIntensity(in_RDI,in_stack_ffffffffffffffb4);
    if ((bVar1) &&
       (((ulong)(in_RDI->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0x100000000) !=
        0)) {
      return true;
    }
  }
  else {
    bVar1 = Station::anyClosed(in_RDI,in_stack_ffffffffffffffb4);
    if ((bVar1) &&
       (((ulong)(in_RDI->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0x10000000000)
        != 0)) {
      return true;
    }
    bVar1 = Station::canIncreaseIntensity(in_RDI,in_stack_ffffffffffffffb4);
    if ((bVar1) &&
       (((ulong)(in_RDI->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0x100000000) !=
        0)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ApertureILS::isBeamletModifiable(int beamlet, Station* station, bool open_flag) {
  for (auto it=tabu.begin(); it!=tabu.end();it++){
    if (it->first->getAngle() == station->getAngle() && it->second == beamlet) return(false);
  }
  
  if (!station->isActiveBeamlet(beamlet)) return(false);
  if (!open_flag) {
    if (station->anyOpen(beamlet) && search_aperture)
      return(true);
    if (station->canReduceIntensity(beamlet) && search_intensity)
      return(true);
  } else {
    if (station->anyClosed(beamlet) && search_aperture)
      return(true);
    if (station->canIncreaseIntensity(beamlet) && search_intensity)
      return(true);    
  }
  return(false);
}